

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  
  uVar1 = this->_sourceTextPtr;
  if (uVar1 < this->_sourceTextSize) {
    this->_sourceTextPtr = uVar1 + 1;
    bVar2 = this->_sourceText[uVar1];
  }
  else {
    this->_reached_eof = 1;
    bVar2 = 0;
  }
  this->_currdata = bVar2;
  lVar4 = this->_currentcolumn + 1;
  this->_currentcolumn = lVar4;
  iVar3 = isxdigit((uint)bVar2);
  if (iVar3 == 0) {
    iVar3 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_HEX_NUMBERS_EXPECTED,(int32_t)this->_tokenline,iVar3,(int)lVar4 - iVar3
              );
  }
  bVar2 = this->_currdata;
  iVar3 = isxdigit((uint)bVar2);
  lVar4 = 0;
  if (0 < maxdigits && iVar3 != 0) {
    do {
      dest[lVar4] = bVar2;
      uVar1 = this->_sourceTextPtr;
      if (uVar1 < this->_sourceTextSize) {
        this->_sourceTextPtr = uVar1 + 1;
        bVar2 = this->_sourceText[uVar1];
      }
      else {
        this->_reached_eof = 1;
        bVar2 = 0;
      }
      lVar4 = lVar4 + 1;
      this->_currdata = bVar2;
      this->_currentcolumn = this->_currentcolumn + 1;
      iVar3 = isxdigit((uint)bVar2);
    } while ((iVar3 != 0) && (lVar4 < maxdigits));
  }
  dest[lVar4] = '\0';
  return lVar4;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR))
        _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_NUMBERS_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}